

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

_Bool prepare_ghost(chunk *c,wchar_t r_idx,monster_conflict *mon,_Bool from_savefile)

{
  bitflag *flags2;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  wchar_t wVar4;
  monster_blow *pmVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  monster_race *pmVar12;
  _Bool _Var13;
  uint32_t uVar14;
  int iVar15;
  int iVar16;
  wchar_t wVar17;
  monster_lore *pmVar18;
  monster_blow *pmVar19;
  long lVar20;
  char *pcVar21;
  ang_file *f;
  size_t sVar22;
  ushort **ppuVar23;
  __int32_t **pp_Var24;
  player_race *ppVar25;
  player_class *ppVar26;
  blow_effect *pbVar27;
  ulong uVar28;
  ghost **ppgVar29;
  ulong uVar30;
  long lVar31;
  ghost_level *pgVar32;
  ghost_info *pgVar33;
  char cVar34;
  monster_race *race;
  wchar_t ghost_class;
  wchar_t ghost_race;
  bitflag non_innate_spells [13];
  bitflag innate_spells [13];
  char buf [80];
  char path [1024];
  
  ghost_class = L'\0';
  race = r_info + r_idx;
  pmVar18 = get_lore(race);
  if (c->ghost == (ghost_info *)0x0) {
    __assert_fail("c->ghost",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x2d7,"_Bool prepare_ghost(struct chunk *, int, struct monster *, _Bool)");
  }
  _Var13 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if ((!_Var13) || (race->level < c->depth + L'\xfffffffb' && !from_savefile)) {
    return false;
  }
  c->ghost->race = r_idx;
  mem_free(r_info[(ulong)z_info->r_max - 1].blow);
  memcpy(r_info + ((ulong)z_info->r_max - 1),race,0xd0);
  pmVar19 = (monster_blow *)mem_alloc((ulong)z_info->mon_blows_max * 0x30);
  r_info[(ulong)z_info->r_max - 1].blow = pmVar19;
  lVar20 = 0x30;
  for (uVar28 = 0; pmVar12 = r_info, uVar28 < z_info->mon_blows_max; uVar28 = uVar28 + 1) {
    pmVar19 = r_info[(ulong)z_info->r_max - 1].blow;
    pmVar5 = race->blow;
    puVar1 = (undefined8 *)((long)&pmVar5[-1].next + lVar20);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    puVar1 = (undefined8 *)((long)pmVar5 + lVar20 + -0x20);
    uVar9 = *puVar1;
    uVar10 = puVar1[1];
    puVar1 = (undefined8 *)((long)pmVar5 + lVar20 + -0x10);
    uVar11 = puVar1[1];
    puVar2 = (undefined8 *)((long)pmVar19 + lVar20 + -0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar11;
    puVar1 = (undefined8 *)((long)pmVar19 + lVar20 + -0x20);
    *puVar1 = uVar9;
    puVar1[1] = uVar10;
    puVar1 = (undefined8 *)((long)&pmVar19[-1].next + lVar20);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    lVar31 = (long)&(r_info[(ulong)z_info->r_max - 1].blow)->next + lVar20;
    if ((int)(z_info->mon_blows_max - 1) <= (int)uVar28) {
      lVar31 = 0;
    }
    *(long *)((long)&r_info[(ulong)z_info->r_max - 1].blow[-1].next + lVar20) = lVar31;
    lVar20 = lVar20 + 0x30;
  }
  uVar28 = (ulong)z_info->r_max;
  mon->race = r_info + (uVar28 - 1);
  pmVar12[uVar28 - 1].rarity = L'\0';
  cVar34 = '\0';
  do {
    if (cVar34 == '\0') {
      pgVar33 = c->ghost;
      wVar17 = pgVar33->bones_selector;
      uVar30 = (ulong)(uint)wVar17;
      if (wVar17 == L'\0') {
        uVar30 = (ulong)(uint)(int)player->depth;
        pgVar33->bones_selector = (int)player->depth;
      }
      else if ((char)wVar17 < '\0') {
        uVar30 = (ulong)(uint)(wVar17 & 0x7fU);
        pgVar33->bones_selector = wVar17 & 0x7fU;
        goto LAB_00175942;
      }
LAB_00175988:
      pcVar6 = ANGBAND_DIR_BONE;
      pcVar21 = format("bone.%03d",uVar30);
      path_build(path,0x400,pcVar6,pcVar21);
    }
    else {
      if (cVar34 == '(') {
        return false;
      }
      uVar14 = Rand_div(z_info->max_depth - 1);
      c->ghost->bones_selector = uVar14 + L'\x01';
      uVar14 = Rand_div(3);
      uVar30 = (ulong)(uint)c->ghost->bones_selector;
      if (uVar14 != 0) goto LAB_00175988;
LAB_00175942:
      pcVar6 = ANGBAND_DIR_GHOST;
      pcVar21 = format("bone.%03d",uVar30);
      path_build(path,0x400,pcVar6,pcVar21);
      c->ghost->bones_selector = c->ghost->bones_selector | 0x80;
    }
    if (path[0] != '\0') {
      f = file_open(path,MODE_READ,FTYPE_TEXT);
      if (f != (ang_file *)0x0) {
        _Var13 = file_getl(f,buf,0x50);
        if (!_Var13) {
          return false;
        }
        my_strcpy(c->ghost->name,buf,0xf);
        _Var13 = file_getl(f,buf,0x50);
        if (!_Var13) {
          return false;
        }
        iVar15 = __isoc99_sscanf(buf,"%d",&ghost_race);
        if (iVar15 != 1) {
          return false;
        }
        _Var13 = file_getl(f,buf,0x50);
        if (!_Var13) {
          return false;
        }
        iVar15 = __isoc99_sscanf(buf,"%d",&ghost_class);
        if (iVar15 != 1) {
          return false;
        }
        _Var13 = file_getl(f,buf,0x50);
        if ((_Var13) && (iVar15 = __isoc99_sscanf(buf,"%d",&c->ghost->string_type), iVar15 != 1)) {
          c->ghost->string_type = L'\0';
        }
        sVar22 = strlen(buf);
        if (sVar22 < 3) {
          c->ghost->string_type = L'\0';
        }
        else {
          my_strcpy(c->ghost->string,buf + 2,sVar22);
        }
        file_close(f);
        for (lVar20 = 0;
            ((lVar20 != 0x10 && (cVar34 = c->ghost->name[lVar20], cVar34 != '\0')) &&
            (cVar34 != ',')); lVar20 = lVar20 + 1) {
        }
        c->ghost->name[lVar20] = '\0';
        pgVar33 = c->ghost;
        cVar34 = pgVar33->name[0];
        if (cVar34 == '\0') {
          sVar22 = strlen(pgVar33->name);
          my_strcpy(pgVar33->name,"Nobody",sVar22);
          pgVar33 = c->ghost;
          cVar34 = pgVar33->name[0];
        }
        ppuVar23 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar23 + (long)cVar34 * 2 + 1) & 2) != 0) {
          pp_Var24 = __ctype_toupper_loc();
          pgVar33->name[0] = (char)(*pp_Var24)[cVar34];
        }
        ppVar25 = player_id2race(ghost_race);
        ppVar26 = player_id2class(ghost_class);
        flags2 = pmVar12[uVar28 - 1].spell_flags;
        ppgVar29 = &ghosts;
        iVar15 = 0;
        do {
          do {
            ppgVar29 = &((ghost *)ppgVar29)->next->next;
            if ((ghost *)ppgVar29 == (ghost *)0x0) {
              if (L'K' < c->depth) {
                pmVar12[uVar28 - 1].spell_power =
                     pmVar12[uVar28 - 1].spell_power + ((uint)(c->depth * 3 - 0xe1U) >> 1);
              }
              uVar14 = 0xffffffff;
              if (c->mon_rating < 0xfffffff6) {
                uVar14 = c->mon_rating + 10;
              }
              c->mon_rating = uVar14;
              pmVar18->sights = 1;
              return true;
            }
            pcVar6 = ((ghost *)ppgVar29)->name;
            iVar16 = strcmp(ppVar25->name,pcVar6);
          } while ((iVar16 != 0) && (iVar16 = strcmp(ppVar26->name,pcVar6), iVar16 != 0));
          pgVar32 = (ghost_level *)&((ghost *)ppgVar29)->level;
          while ((pgVar32 = pgVar32->next, pgVar32 != (ghost_level *)0x0 &&
                 (pgVar32->level <= pmVar12[uVar28 - 1].level))) {
            wVar17 = (pgVar32->spell_power).param1;
            if (wVar17 != L'\0') {
              pmVar12[uVar28 - 1].spell_power =
                   (wVar17 * pmVar12[uVar28 - 1].spell_power) / (pgVar32->spell_power).param2;
            }
            pmVar12[uVar28 - 1].hearing = pmVar12[uVar28 - 1].hearing + pgVar32->hearing;
            wVar17 = (pgVar32->avg_hp).param1;
            if (wVar17 != L'\0') {
              pmVar12[uVar28 - 1].avg_hp =
                   (wVar17 * pmVar12[uVar28 - 1].avg_hp) / (pgVar32->avg_hp).param2;
            }
            wVar17 = (pgVar32->ac).param1;
            if (wVar17 != L'\0') {
              pmVar12[uVar28 - 1].ac = (wVar17 * pmVar12[uVar28 - 1].ac) / (pgVar32->ac).param2;
            }
            wVar17 = (pgVar32->blow_sides).param1;
            if (wVar17 != L'\0') {
              uVar3 = z_info->mon_blows_max;
              for (lVar20 = 0; (ulong)uVar3 * 0x30 - lVar20 != 0; lVar20 = lVar20 + 0x30) {
                pmVar19 = pmVar12[uVar28 - 1].blow;
                if (*(long *)((long)&pmVar19->method + lVar20) != 0) {
                  *(int *)((long)&(pmVar19->dice).sides + lVar20) =
                       (*(int *)((long)&(pmVar19->dice).sides + lVar20) * wVar17) /
                       (pgVar32->blow_sides).param2;
                }
              }
            }
            wVar17 = (pgVar32->speed).param1;
            if (wVar17 != L'\0') {
              wVar17 = wVar17 + pmVar12[uVar28 - 1].speed;
              wVar4 = (pgVar32->speed).param2;
              if (wVar4 <= wVar17) {
                wVar17 = wVar4;
              }
              pmVar12[uVar28 - 1].speed = wVar17;
            }
            pcVar6 = pgVar32->blow_effect1;
            if (iVar15 == 0 && pcVar6 != (char *)0x0) {
              uVar3 = z_info->mon_blows_max;
              lVar20 = 0;
              do {
                lVar31 = lVar20;
                iVar15 = 0;
                if (((ulong)uVar3 * 0x30 + 0x30 == lVar31 + 0x30) ||
                   (puVar1 = *(undefined8 **)((long)&(pmVar12[uVar28 - 1].blow)->effect + lVar31),
                   puVar1 == (undefined8 *)0x0)) goto LAB_00175d64;
                iVar15 = strcmp((char *)*puVar1,"HURT");
                lVar20 = lVar31 + 0x30;
              } while (iVar15 != 0);
              pbVar27 = lookup_monster_blow_effect(pcVar6);
              *(blow_effect **)((long)&(pmVar12[uVar28 - 1].blow)->effect + lVar31) = pbVar27;
              iVar15 = 1;
            }
LAB_00175d64:
            pcVar6 = pgVar32->blow_effect2;
            if (iVar15 == 1 && pcVar6 != (char *)0x0) {
              uVar3 = z_info->mon_blows_max;
              lVar20 = 0;
              do {
                lVar31 = lVar20;
                if (((ulong)uVar3 * 0x30 + 0x30 == lVar31 + 0x30) ||
                   (puVar1 = *(undefined8 **)((long)&(pmVar12[uVar28 - 1].blow)->effect + lVar31),
                   puVar1 == (undefined8 *)0x0)) {
                  iVar15 = 1;
                  goto LAB_00175de4;
                }
                iVar15 = strcmp((char *)*puVar1,"HURT");
                lVar20 = lVar31 + 0x30;
              } while (iVar15 != 0);
              pbVar27 = lookup_monster_blow_effect(pcVar6);
              *(blow_effect **)((long)&(pmVar12[uVar28 - 1].blow)->effect + lVar31) = pbVar27;
              iVar15 = 2;
            }
LAB_00175de4:
            flag_union(pmVar12[uVar28 - 1].flags,pgVar32->flags,0xc);
            flag_diff(pmVar12[uVar28 - 1].flags,pgVar32->flags_off,0xc);
            flag_union(flags2,pgVar32->spell_flags,0xc);
            flag_diff(flags2,pgVar32->spell_flags_off,0xc);
          }
          if (((ghost *)ppgVar29)->freq_if_zero != L'\0') {
            create_mon_spell_mask(innate_spells,0x800,0);
            flag_inter(innate_spells,flags2,0xd);
            _Var13 = flag_is_empty(innate_spells,0xd);
            if ((!_Var13) && (pmVar12[uVar28 - 1].freq_innate == L'\0')) {
              pmVar12[uVar28 - 1].freq_innate = ((ghost *)ppgVar29)->freq_if_zero;
            }
            flag_copy(non_innate_spells,flags2,0xd);
            flag_diff(non_innate_spells,innate_spells,0xd);
            _Var13 = flag_is_empty(non_innate_spells,0xd);
            if ((!_Var13) && (pmVar12[uVar28 - 1].freq_spell == L'\0')) {
              pmVar12[uVar28 - 1].freq_spell = ((ghost *)ppgVar29)->freq_if_zero;
            }
          }
          if (((ghost *)ppgVar29)->freq_if_positive != L'\0') {
            create_mon_spell_mask(innate_spells,0x800,0);
            flag_inter(innate_spells,flags2,0xd);
            if (pmVar12[uVar28 - 1].freq_innate != L'\0') {
              _Var13 = flag_is_empty(innate_spells,0xd);
              wVar17 = L'\0';
              if (!_Var13) {
                wVar17 = pmVar12[uVar28 - 1].freq_innate + ((ghost *)ppgVar29)->freq_if_positive;
              }
              pmVar12[uVar28 - 1].freq_innate = wVar17;
            }
            flag_copy(non_innate_spells,flags2,0xd);
            flag_diff(non_innate_spells,innate_spells,0xd);
            if (pmVar12[uVar28 - 1].freq_spell != L'\0') {
              _Var13 = flag_is_empty(non_innate_spells,0xd);
              wVar17 = L'\0';
              if (!_Var13) {
                wVar17 = pmVar12[uVar28 - 1].freq_spell + ((ghost *)ppgVar29)->freq_if_positive;
              }
              pmVar12[uVar28 - 1].freq_spell = wVar17;
            }
          }
        } while( true );
      }
      c->ghost->bones_selector = L'\0';
    }
    cVar34 = cVar34 + '\x01';
  } while( true );
}

Assistant:

bool prepare_ghost(struct chunk *c, int r_idx, struct monster *mon,
				   bool from_savefile)
{
	int ghost_race, ghost_class = 0;
	uint8_t try, i;
	uint16_t iblow;

	struct monster_race *race = &r_info[r_idx];
	struct monster_lore *lore = get_lore(race);
	struct player_race *p_race;
	struct player_class *class;

	ang_file *fp = NULL;
	char path[1024];
	char buf[80];

	/* Paranoia. */
	assert(c->ghost);
	if (!rf_has(race->flags, RF_PLAYER_GHOST))
		return false;

	/* Hack -- No easy player ghosts, unless the ghost is from a savefile.
	 * This also makes player ghosts much rarer, and effectively (almost)
	 * prevents more than one from being on a level. From 0.5.1, other code
	 * makes it is formally impossible to have more than one ghost at a time.
	 * -BR- */
	if ((race->level < c->depth - 5) && (from_savefile == false))
		return false;

	/* Store the index of the base race. */
	c->ghost->race = r_idx;

	/* Copy the info from the template to the special "ghost slot", and use
	 * that from here on.  Melee blows have to be deeply copied so those of
	 * the base race are not modified. */
	mem_free(r_info[PLAYER_GHOST_RACE].blow);
	memcpy(&r_info[PLAYER_GHOST_RACE], race, sizeof(*race));
	r_info[PLAYER_GHOST_RACE].blow = mem_alloc(z_info->mon_blows_max
		* sizeof(*r_info[PLAYER_GHOST_RACE].blow));
	for (iblow = 0; iblow < z_info->mon_blows_max; ++iblow) {
		r_info[PLAYER_GHOST_RACE].blow[iblow] = race->blow[iblow];
		r_info[PLAYER_GHOST_RACE].blow[iblow].next =
			(iblow < z_info->mon_blows_max - 1) ?
			r_info[PLAYER_GHOST_RACE].blow + iblow + 1 : NULL;
	}
	race = &r_info[PLAYER_GHOST_RACE];
	mon->race = race;

	/* Set rarity to 0 so the ghost can't rise again */
	race->rarity = 0;

	/* Choose a bones file.  Use the variable bones_selector if it has any
	 * information in it (this allows saved ghosts to reacquire all special
	 * features), then use the current depth, and finally pick at random.
	 *
	 * Note the hackery with bitflags to choose between a genuine player
	 * ghost and a preloaded one, and the chance that a ghost will be
	 * different on reloading on a multiplayer server if someone else has
	 * killed the original one in the mean time. */
	for (try = 0; try < 40; ++try) {
		/* Prepare a path, and store the file number for future reference. */
		if (try == 0) {
			if (!c->ghost->bones_selector) {
				/* Try for an actual ghost of the player's depth first */
				c->ghost->bones_selector = player->depth;
				path_build(path, sizeof(path), ANGBAND_DIR_BONE,
						   format("bone.%03d", c->ghost->bones_selector));
			} else {
				/* Loading a preloaded ghost from savefile */
				if (c->ghost->bones_selector & 0x80) {
					c->ghost->bones_selector &= 0x7F;
					path_build(path, sizeof(path), ANGBAND_DIR_GHOST,
							   format("bone.%03d", c->ghost->bones_selector));
					c->ghost->bones_selector |= 0x80;
				} else {
					/* Loading an actual ghost from savefile */
					path_build(path, sizeof(path), ANGBAND_DIR_BONE,
							   format("bone.%03d", c->ghost->bones_selector));
				}
			}
		} else {
			/* Just pick a random depth if we can't get the player's */
			c->ghost->bones_selector = randint1(z_info->max_depth - 1);

			/* After the first attempt, randomly try preloaded ghosts */
			if (!one_in_(3)) {
				path_build(path, sizeof(path), ANGBAND_DIR_BONE,
						   format("bone.%03d", c->ghost->bones_selector));
			} else {
				path_build(path, sizeof(path), ANGBAND_DIR_GHOST,
						   format("bone.%03d", c->ghost->bones_selector));
				c->ghost->bones_selector |= 0x80;
			}
		}

		/* Check we actually have a path */
		if (strlen(path) == 0) continue;

		/* Attempt to open the bones file. */
		fp = file_open(path, MODE_READ, FTYPE_TEXT);

		/* No bones file with that number, try again. */
		if (!fp) {
			c->ghost->bones_selector = 0;
			continue;
		}

		/* Success. */
		if (fp) break;
	}

	/* No bones file found, so no Ghost is made. */
	if (!fp) return false;

	/* Scan the file */

	/* Name */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	my_strcpy(c->ghost->name, buf, GHOST_NAME_LENGTH);

	/* Race */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	if (1 != sscanf(buf, "%d", &ghost_race)) return false;

	/* Class */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	if (1 != sscanf(buf, "%d", &ghost_class)) return false;

	/* String type (maybe) */
	if (file_getl(fp, buf, sizeof(buf))) {
		if (1 != sscanf(buf, "%d", &c->ghost->string_type))
			c->ghost->string_type = 0;
	}

	/* String (maybe) */
	if (strlen(buf) > 2) {
		my_strcpy(c->ghost->string, buf + 2, strlen(buf));
	} else {
		c->ghost->string_type = 0;
	}

	/* Close the file */
	file_close(fp);

	/* Process the ghost name and store it. */
	for (i = 0; (i < 16) && (c->ghost->name[i]) &&
			 (c->ghost->name[i] != ','); i++);

	/* Terminate the name */
	c->ghost->name[i] = '\0';

	/* Force a name */
	if (!c->ghost->name[0]) {
		my_strcpy(c->ghost->name, "Nobody", strlen(c->ghost->name));
	}

	/* Capitalize the name */
	if (islower(c->ghost->name[0])) {
		c->ghost->name[0] = toupper(c->ghost->name[0]);
	}

	/* Process race and class. */
	p_race = player_id2race(ghost_race);
	class = player_id2class(ghost_class);
	process_ghost_race_class(p_race, class, race);

	/* A little extra help for the deepest ghosts */
	if (c->depth > 75) {
		race->spell_power += 3 * (c->depth - 75) / 2;
	}

	/* Increase the level feeling */
	add_to_monster_rating(c, 10);

	/* Player ghosts are "seen" whenever generated. */
	lore->sights = 1;

	/* Success */
	return true;
}